

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O2

floatx80 commonNaNToFloatx80(commonNaNT a,float_status *status)

{
  ulong uVar1;
  ulong uVar2;
  floatx80 fVar3;
  
  if (status->default_nan_mode == '\0') {
    if (1 < a.high) {
      uVar2 = a.high >> 1 | 0x8000000000000000;
      uVar1 = (ulong)(a._0_4_ << 0xf | 0x7fff);
      goto LAB_00823360;
    }
  }
  uVar2 = 0xc000000000000000;
  fVar3 = floatx80_default_nan_mips64el(status);
  uVar1 = CONCAT62(fVar3._10_6_,0xffff);
LAB_00823360:
  fVar3._8_8_ = uVar1;
  fVar3.low = uVar2;
  return fVar3;
}

Assistant:

static floatx80 commonNaNToFloatx80(commonNaNT a, float_status *status)
{
    floatx80 z;

    if (status->default_nan_mode) {
        return floatx80_default_nan(status);
    }

    if (a.high >> 1) {
        z.low = UINT64_C(0x8000000000000000) | a.high >> 1;
        z.high = (((uint16_t)a.sign) << 15) | 0x7FFF;
    } else {
        z = floatx80_default_nan(status);
    }
    return z;
}